

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

UniValue * __thiscall
ExternalSigner::DisplayAddress
          (UniValue *__return_storage_ptr__,ExternalSigner *this,string *descriptor)

{
  long in_FS_OFFSET;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(&local_c8,&this->m_command," --fingerprint ");
  std::operator+(&local_a8,&local_c8,&this->m_fingerprint);
  NetworkArg_abi_cxx11_(&local_e8,this);
  std::operator+(&local_88,&local_a8,&local_e8);
  std::operator+(&local_68,&local_88," displayaddress --desc ");
  std::operator+(&local_48,&local_68,descriptor);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
  RunCommandParseJSON(__return_storage_ptr__,&local_48,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ExternalSigner::DisplayAddress(const std::string& descriptor) const
{
    return RunCommandParseJSON(m_command + " --fingerprint " + m_fingerprint + NetworkArg() + " displayaddress --desc " + descriptor);
}